

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::ReadMemoryResponse>::construct
          (BasicTypeInfo<dap::ReadMemoryResponse> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::ReadMemoryResponse> *this_local;
  
  memset(ptr,0,0x58);
  ReadMemoryResponse::ReadMemoryResponse((ReadMemoryResponse *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }